

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int Fax3Decode1D(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  uint32_t lastx_00;
  uint8_t *puVar1;
  long lVar2;
  uint32_t *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  char *pcVar8;
  byte *pbVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  uint local_2ac;
  uint local_28c;
  uint local_26c;
  uint local_24c;
  uint local_20c;
  uint local_1ec;
  uint local_1cc;
  uint local_1ac;
  uint local_18c;
  uint local_16c;
  uint local_14c;
  uint local_12c;
  uint local_10c;
  uint local_ec;
  uint local_cc;
  uint local_ac;
  TIFFFaxTabEnt *TabEnt;
  uchar *bitmap;
  int EOLcnt;
  uint32_t *thisrun;
  uint32_t *pa;
  uchar *ep;
  uchar *cp;
  int local_48;
  int RunLength;
  int BitsAvail;
  uint32_t BitAcc;
  int lastx;
  int a0;
  Fax3CodecState *sp;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t occ_local;
  uint8_t *buf_local;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  lastx_00 = *(uint32_t *)(puVar1 + 0x10);
  lVar2 = *(long *)(puVar1 + 0x40);
  if (occ % *(long *)(puVar1 + 8) != 0) {
    TIFFErrorExtR(tif,"Fax3Decode1D","Fractional scanlines cannot be read");
    return -1;
  }
  RunLength = *(int *)(puVar1 + 0x48);
  local_48 = *(int *)(puVar1 + 0x4c);
  bitmap._4_4_ = *(int *)(puVar1 + 0x50);
  ep = tif->tif_rawcp;
  pbVar7 = ep + tif->tif_rawcc;
  puVar3 = *(uint32_t **)(puVar1 + 0x78);
  tStack_28 = occ;
  occ_local = (tmsize_t)buf;
LAB_003ce57a:
  if (tStack_28 < 1) {
    *(int *)(puVar1 + 0x4c) = local_48;
    *(int *)(puVar1 + 0x48) = RunLength;
    *(int *)(puVar1 + 0x50) = bitmap._4_4_;
    tif->tif_rawcc = tif->tif_rawcc - ((long)ep - (long)tif->tif_rawcp);
    tif->tif_rawcp = ep;
    return 1;
  }
  BitAcc = 0;
  if (bitmap._4_4_ == 0) {
    while( true ) {
      pbVar9 = ep;
      iVar4 = local_48;
      if (local_48 < 0xb) {
        if (ep < pbVar7) {
          pbVar9 = ep + 1;
          RunLength = (uint)*(byte *)(lVar2 + (ulong)*ep) << ((byte)local_48 & 0x1f) | RunLength;
          iVar4 = local_48 + 8;
          if (iVar4 < 0xb) {
            if (pbVar9 < pbVar7) {
              RunLength = (uint)*(byte *)(lVar2 + (ulong)*pbVar9) << ((byte)iVar4 & 0x1f) |
                          RunLength;
              pbVar9 = ep + 2;
              iVar4 = local_48 + 0x10;
            }
            else {
              local_48 = 0xb;
              iVar4 = local_48;
            }
          }
        }
        else {
          if (local_48 == 0) goto LAB_003cf85a;
          local_48 = 0xb;
          iVar4 = local_48;
        }
      }
      local_48 = iVar4;
      ep = pbVar9;
      if ((RunLength & 0x7ffU) == 0) break;
      local_48 = local_48 + -1;
      RunLength = (uint)RunLength >> 1;
    }
  }
  while( true ) {
    if (local_48 < 8) {
      if (ep < pbVar7) {
        RunLength = (uint)*(byte *)(lVar2 + (ulong)*ep) << ((byte)local_48 & 0x1f) | RunLength;
        local_48 = local_48 + 8;
        ep = ep + 1;
      }
      else {
        if (local_48 == 0) goto LAB_003cf85a;
        local_48 = 8;
      }
    }
    if ((RunLength & 0xffU) != 0) break;
    local_48 = local_48 + -8;
    RunLength = (uint)RunLength >> 8;
  }
  for (; (RunLength & 1U) == 0; RunLength = (uint)RunLength >> 1) {
    local_48 = local_48 + -1;
  }
  local_48 = local_48 + -1;
  RunLength = (uint)RunLength >> 1;
  bitmap._4_4_ = 0;
  puVar11 = puVar3;
LAB_003ce735:
  thisrun = puVar11;
  cp._4_4_ = 0;
  do {
    pbVar9 = ep;
    iVar4 = local_48;
    puVar10 = thisrun;
    if (local_48 < 0xc) {
      if (ep < pbVar7) {
        pbVar9 = ep + 1;
        RunLength = (uint)*(byte *)(lVar2 + (ulong)*ep) << ((byte)local_48 & 0x1f) | RunLength;
        iVar4 = local_48 + 8;
        if (iVar4 < 0xc) {
          if (pbVar9 < pbVar7) {
            RunLength = (uint)*(byte *)(lVar2 + (ulong)*pbVar9) << ((byte)iVar4 & 0x1f) | RunLength;
            pbVar9 = ep + 2;
            iVar4 = local_48 + 0x10;
          }
          else {
            local_48 = 0xc;
            iVar4 = local_48;
          }
        }
      }
      else {
        if (local_48 == 0) goto LAB_003cec5c;
        local_48 = 0xc;
        iVar4 = local_48;
      }
    }
    local_48 = iVar4;
    ep = pbVar9;
    uVar5 = RunLength & 0xfff;
    local_48 = local_48 - (uint)TIFFFaxWhiteTable[uVar5].Width;
    RunLength = (uint)RunLength >> (TIFFFaxWhiteTable[uVar5].Width & 0x1f);
    switch(TIFFFaxWhiteTable[uVar5].State) {
    case '\a':
      goto LAB_003ce860;
    default:
      Fax3Unexpected("Fax3Decode1D",tif,*(uint32_t *)(puVar1 + 0x98),BitAcc);
      goto LAB_003cf240;
    case '\t':
    case '\v':
      BitAcc = TIFFFaxWhiteTable[uVar5].Param + BitAcc;
      cp._4_4_ = TIFFFaxWhiteTable[uVar5].Param + cp._4_4_;
      break;
    case '\f':
      bitmap._4_4_ = 1;
      goto LAB_003cf240;
    }
  } while( true );
LAB_003ce860:
  if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
    pcVar8 = "strip";
    if ((tif->tif_flags & 0x400) != 0) {
      pcVar8 = "tile";
    }
    if ((tif->tif_flags & 0x400) == 0) {
      local_ac = tif->tif_curstrip;
    }
    else {
      local_ac = tif->tif_curtile;
    }
    TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                  (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_ac);
    return -1;
  }
  puVar10 = thisrun + 1;
  *thisrun = cp._4_4_ + TIFFFaxWhiteTable[uVar5].Param;
  BitAcc = TIFFFaxWhiteTable[uVar5].Param + BitAcc;
  cp._4_4_ = 0;
  if ((int)lastx_00 <= (int)BitAcc) goto LAB_003cf240;
  while( true ) {
    pbVar9 = ep;
    iVar4 = local_48;
    if (local_48 < 0xd) {
      if (ep < pbVar7) {
        pbVar9 = ep + 1;
        RunLength = (uint)*(byte *)(lVar2 + (ulong)*ep) << ((byte)local_48 & 0x1f) | RunLength;
        iVar4 = local_48 + 8;
        if (iVar4 < 0xd) {
          if (pbVar9 < pbVar7) {
            RunLength = (uint)*(byte *)(lVar2 + (ulong)*pbVar9) << ((byte)iVar4 & 0x1f) | RunLength;
            pbVar9 = ep + 2;
            iVar4 = local_48 + 0x10;
          }
          else {
            local_48 = 0xd;
            iVar4 = local_48;
          }
        }
      }
      else {
        if (local_48 == 0) goto LAB_003cec5c;
        local_48 = 0xd;
        iVar4 = local_48;
      }
    }
    local_48 = iVar4;
    ep = pbVar9;
    uVar5 = RunLength & 0x1fff;
    local_48 = local_48 - (uint)TIFFFaxBlackTable[uVar5].Width;
    RunLength = (uint)RunLength >> (TIFFFaxBlackTable[uVar5].Width & 0x1f);
    uVar6 = (uint)TIFFFaxBlackTable[uVar5].State;
    if (uVar6 == 8) break;
    if (1 < uVar6 - 10) {
      if (uVar6 == 0xc) {
        bitmap._4_4_ = 1;
      }
      else {
        Fax3Unexpected("Fax3Decode1D",tif,*(uint32_t *)(puVar1 + 0x98),BitAcc);
      }
      goto LAB_003cf240;
    }
    BitAcc = TIFFFaxBlackTable[uVar5].Param + BitAcc;
    cp._4_4_ = TIFFFaxBlackTable[uVar5].Param + cp._4_4_;
  }
  if (puVar3 + *(uint *)(puVar1 + 0x68) <= puVar10) {
    pcVar8 = "strip";
    if ((tif->tif_flags & 0x400) != 0) {
      pcVar8 = "tile";
    }
    if ((tif->tif_flags & 0x400) == 0) {
      local_cc = tif->tif_curstrip;
    }
    else {
      local_cc = tif->tif_curtile;
    }
    TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                  (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_cc);
    return -1;
  }
  puVar11 = thisrun + 2;
  *puVar10 = cp._4_4_ + TIFFFaxBlackTable[uVar5].Param;
  BitAcc = TIFFFaxBlackTable[uVar5].Param + BitAcc;
  cp._4_4_ = 0;
  puVar10 = puVar11;
  if ((int)lastx_00 <= (int)BitAcc) goto LAB_003cf240;
  if ((thisrun[1] == 0) && (*thisrun == 0)) {
    puVar11 = thisrun;
  }
  goto LAB_003ce735;
LAB_003cec5c:
  thisrun = puVar10;
  Fax3PrematureEOF("Fax3Decode1D",tif,*(uint32_t *)(puVar1 + 0x98),BitAcc);
  if (cp._4_4_ != 0) {
    if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
      pcVar8 = "strip";
      if ((tif->tif_flags & 0x400) != 0) {
        pcVar8 = "tile";
      }
      if ((tif->tif_flags & 0x400) == 0) {
        local_ec = tif->tif_curstrip;
      }
      else {
        local_ec = tif->tif_curtile;
      }
      TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                    (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_ec);
      return -1;
    }
    *thisrun = cp._4_4_;
    cp._4_4_ = 0;
    thisrun = thisrun + 1;
  }
  if (BitAcc != lastx_00) {
    Fax3BadLength("Fax3Decode1D",tif,*(uint32_t *)(puVar1 + 0x98),BitAcc,lastx_00);
    while ((int)lastx_00 < (int)BitAcc && puVar3 < thisrun) {
      BitAcc = BitAcc - thisrun[-1];
      thisrun = thisrun + -1;
    }
    if ((int)BitAcc < (int)lastx_00) {
      if ((int)BitAcc < 0) {
        BitAcc = 0;
      }
      if (((long)thisrun - (long)puVar3 >> 2 & 1U) != 0) {
        if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
          pcVar8 = "strip";
          if ((tif->tif_flags & 0x400) != 0) {
            pcVar8 = "tile";
          }
          if ((tif->tif_flags & 0x400) == 0) {
            local_10c = tif->tif_curstrip;
          }
          else {
            local_10c = tif->tif_curtile;
          }
          TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                        (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_10c);
          return -1;
        }
        *thisrun = cp._4_4_;
        cp._4_4_ = 0;
        thisrun = thisrun + 1;
      }
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_12c = tif->tif_curstrip;
        }
        else {
          local_12c = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_12c);
        return -1;
      }
      *thisrun = cp._4_4_ + (lastx_00 - BitAcc);
      thisrun = thisrun + 1;
    }
    else if ((int)lastx_00 < (int)BitAcc) {
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_14c = tif->tif_curstrip;
        }
        else {
          local_14c = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_14c);
        return -1;
      }
      puVar11 = thisrun + 1;
      *thisrun = cp._4_4_ + lastx_00;
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= puVar11) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_16c = tif->tif_curstrip;
        }
        else {
          local_16c = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_16c);
        return -1;
      }
      thisrun = thisrun + 2;
      *puVar11 = 0;
    }
  }
  goto LAB_003cfe20;
LAB_003cf240:
  thisrun = puVar10;
  if (cp._4_4_ != 0) {
    if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
      pcVar8 = "strip";
      if ((tif->tif_flags & 0x400) != 0) {
        pcVar8 = "tile";
      }
      if ((tif->tif_flags & 0x400) == 0) {
        local_18c = tif->tif_curstrip;
      }
      else {
        local_18c = tif->tif_curtile;
      }
      TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                    (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_18c);
      return -1;
    }
    *thisrun = cp._4_4_;
    cp._4_4_ = 0;
    thisrun = thisrun + 1;
  }
  if (BitAcc != lastx_00) {
    Fax3BadLength("Fax3Decode1D",tif,*(uint32_t *)(puVar1 + 0x98),BitAcc,lastx_00);
    while ((int)lastx_00 < (int)BitAcc && puVar3 < thisrun) {
      BitAcc = BitAcc - thisrun[-1];
      thisrun = thisrun + -1;
    }
    if ((int)BitAcc < (int)lastx_00) {
      if ((int)BitAcc < 0) {
        BitAcc = 0;
      }
      if (((long)thisrun - (long)puVar3 >> 2 & 1U) != 0) {
        if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
          pcVar8 = "strip";
          if ((tif->tif_flags & 0x400) != 0) {
            pcVar8 = "tile";
          }
          if ((tif->tif_flags & 0x400) == 0) {
            local_1ac = tif->tif_curstrip;
          }
          else {
            local_1ac = tif->tif_curtile;
          }
          TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                        (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_1ac);
          return -1;
        }
        *thisrun = cp._4_4_;
        cp._4_4_ = 0;
        thisrun = thisrun + 1;
      }
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_1cc = tif->tif_curstrip;
        }
        else {
          local_1cc = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_1cc);
        return -1;
      }
      *thisrun = cp._4_4_ + (lastx_00 - BitAcc);
      thisrun = thisrun + 1;
    }
    else if ((int)lastx_00 < (int)BitAcc) {
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_1ec = tif->tif_curstrip;
        }
        else {
          local_1ec = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_1ec);
        return -1;
      }
      puVar11 = thisrun + 1;
      *thisrun = cp._4_4_ + lastx_00;
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= puVar11) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_20c = tif->tif_curstrip;
        }
        else {
          local_20c = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_20c);
        return -1;
      }
      thisrun = thisrun + 2;
      *puVar11 = 0;
    }
  }
  (**(code **)(puVar1 + 0x58))(occ_local,puVar3,thisrun,lastx_00);
  occ_local = *(long *)(puVar1 + 8) + occ_local;
  tStack_28 = tStack_28 - *(long *)(puVar1 + 8);
  *(int *)(puVar1 + 0x98) = *(int *)(puVar1 + 0x98) + 1;
  goto LAB_003ce57a;
LAB_003cf85a:
  BitAcc = 0;
  thisrun = puVar3;
  if (lastx_00 != 0) {
    Fax3BadLength("Fax3Decode1D",tif,*(uint32_t *)(puVar1 + 0x98),0,lastx_00);
    while ((int)lastx_00 < (int)BitAcc && puVar3 < thisrun) {
      BitAcc = BitAcc - thisrun[-1];
      thisrun = thisrun + -1;
    }
    if ((int)BitAcc < (int)lastx_00) {
      if ((int)BitAcc < 0) {
        BitAcc = 0;
      }
      if (((long)thisrun - (long)puVar3 >> 2 & 1U) != 0) {
        if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
          pcVar8 = "strip";
          if ((tif->tif_flags & 0x400) != 0) {
            pcVar8 = "tile";
          }
          if ((tif->tif_flags & 0x400) == 0) {
            local_24c = tif->tif_curstrip;
          }
          else {
            local_24c = tif->tif_curtile;
          }
          TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                        (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_24c);
          return -1;
        }
        *thisrun = 0;
        thisrun = thisrun + 1;
      }
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_26c = tif->tif_curstrip;
        }
        else {
          local_26c = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_26c);
        return -1;
      }
      *thisrun = lastx_00 - BitAcc;
      thisrun = thisrun + 1;
    }
    else if ((int)lastx_00 < (int)BitAcc) {
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_28c = tif->tif_curstrip;
        }
        else {
          local_28c = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_28c);
        return -1;
      }
      *thisrun = lastx_00;
      if (puVar3 + *(uint *)(puVar1 + 0x68) <= thisrun + 1) {
        pcVar8 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar8 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_2ac = tif->tif_curstrip;
        }
        else {
          local_2ac = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar1 + 0x98),pcVar8,(ulong)local_2ac);
        return -1;
      }
      thisrun[1] = 0;
      thisrun = thisrun + 2;
    }
  }
LAB_003cfe20:
  (**(code **)(puVar1 + 0x58))(occ_local,puVar3,thisrun,lastx_00);
  *(int *)(puVar1 + 0x4c) = local_48;
  *(int *)(puVar1 + 0x48) = RunLength;
  *(int *)(puVar1 + 0x50) = bitmap._4_4_;
  tif->tif_rawcc = tif->tif_rawcc - ((long)ep - (long)tif->tif_rawcp);
  tif->tif_rawcp = ep;
  return -1;
}

Assistant:

static int Fax3Decode1D(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    DECLARE_STATE(tif, sp, "Fax3Decode1D");
    (void)s;
    if (occ % sp->b.rowbytes)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (-1);
    }
    CACHE_STATE(tif, sp);
    thisrun = sp->curruns;
    while (occ > 0)
    {
        a0 = 0;
        RunLength = 0;
        pa = thisrun;
#ifdef FAX3_DEBUG
        printf("\nBitAcc=%08" PRIX32 ", BitsAvail = %d\n", BitAcc, BitsAvail);
        printf("-------------------- %" PRIu32 "\n", tif->tif_row);
        fflush(stdout);
#endif
        SYNC_EOL(EOF1D);
        EXPAND1D(EOF1Da);
        (*sp->fill)(buf, thisrun, pa, lastx);
        buf += sp->b.rowbytes;
        occ -= sp->b.rowbytes;
        sp->line++;
        continue;
    EOF1D: /* premature EOF */
        CLEANUP_RUNS();
    EOF1Da: /* premature EOF */
        (*sp->fill)(buf, thisrun, pa, lastx);
        UNCACHE_STATE(tif, sp);
        return (-1);
    }
    UNCACHE_STATE(tif, sp);
    return (1);
}